

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O0

void __thiscall
ymfm::ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::resample_1_n<3>
          (ssg_resampler<ymfm::ymfm_output<3>,_2,_true> *this,ymfm_output<3> *output,
          uint32_t numsamples)

{
  int local_30;
  int32_t local_2c;
  int rep;
  int32_t sum2;
  int32_t sum1;
  int32_t sum0;
  uint32_t samp;
  uint32_t numsamples_local;
  ymfm_output<3> *output_local;
  ssg_resampler<ymfm::ymfm_output<3>,_2,_true> *this_local;
  
  sum0 = numsamples;
  _samp = output;
  output_local = (ymfm_output<3> *)this;
  for (sum1 = 0; (uint)sum1 < (uint)sum0; sum1 = sum1 + 1) {
    sum2 = 0;
    rep = 0;
    local_2c = 0;
    for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
      clock_and_add(this,&sum2,&rep,&local_2c,1);
    }
    write_to_output(this,_samp,sum2,rep,local_2c,3);
    _samp = _samp + 1;
  }
  return;
}

Assistant:

void ssg_resampler<OutputType, FirstOutput, MixTo1>::resample_1_n(OutputType *output, uint32_t numsamples)
{
	for (uint32_t samp = 0; samp < numsamples; samp++, output++)
	{
		int32_t sum0 = 0, sum1 = 0, sum2 = 0;
		for (int rep = 0; rep < Divisor; rep++)
			clock_and_add(sum0, sum1, sum2);
		write_to_output(output, sum0, sum1, sum2, Divisor);
	}
}